

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

IpEndpointName __thiscall
UdpSocket::Implementation::LocalEndpointFor(Implementation *this,IpEndpointName *remoteEndpoint)

{
  int iVar1;
  runtime_error *prVar2;
  int *piVar3;
  IpEndpointName IVar4;
  IpEndpointName IVar5;
  undefined1 local_68 [4];
  int connectResult;
  sockaddr_in unconnectSockAddr;
  socklen_t length;
  sockaddr_in sockAddr;
  undefined1 local_38 [8];
  sockaddr_in connectSockAddr;
  IpEndpointName *remoteEndpoint_local;
  Implementation *this_local;
  
  connectSockAddr.sin_zero = (uchar  [8])remoteEndpoint;
  if ((this->isBound_ & 1U) == 0) {
    __assert_fail("isBound_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/ip/posix/UdpSocket.cpp"
                  ,0x94,
                  "IpEndpointName UdpSocket::Implementation::LocalEndpointFor(const IpEndpointName &) const"
                 );
  }
  SockaddrFromIpEndpointName((sockaddr_in *)local_38,remoteEndpoint);
  iVar1 = connect(this->socket_,(sockaddr *)local_38,0x10);
  if (-1 < iVar1) {
    memset(unconnectSockAddr.sin_zero + 4,0,0x10);
    unconnectSockAddr.sin_zero[0] = '\x10';
    unconnectSockAddr.sin_zero[1] = '\0';
    unconnectSockAddr.sin_zero[2] = '\0';
    unconnectSockAddr.sin_zero[3] = '\0';
    iVar1 = getsockname(this->socket_,(sockaddr *)(unconnectSockAddr.sin_zero + 4),
                        (socklen_t *)unconnectSockAddr.sin_zero);
    if (iVar1 < 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"unable to getsockname\n");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->isConnected_ & 1U) == 0) {
      memset(local_68,0,0x10);
      local_68._0_2_ = 0;
      iVar1 = connect(this->socket_,(sockaddr *)local_68,0x10);
      if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 != 0x61)) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"unable to un-connect udp socket\n");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar1 = connect(this->socket_,(sockaddr *)&this->connectedAddr_,0x10);
      if (iVar1 < 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"unable to connect udp socket\n");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    IVar4 = IpEndpointNameFromSockaddr((sockaddr_in *)(unconnectSockAddr.sin_zero + 4));
    IVar5._12_4_ = 0;
    IVar5.address = SUB128(IVar4._0_12_,0);
    IVar5.port = SUB124(IVar4._0_12_,8);
    return IVar5;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"unable to connect udp socket\n");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IpEndpointName LocalEndpointFor( const IpEndpointName& remoteEndpoint ) const
	{
		assert( isBound_ );

		// first connect the socket to the remote server
        
        struct sockaddr_in connectSockAddr;
		SockaddrFromIpEndpointName( connectSockAddr, remoteEndpoint );
       
        if (connect(socket_, (struct sockaddr *)&connectSockAddr, sizeof(connectSockAddr)) < 0) {
            throw std::runtime_error("unable to connect udp socket\n");
        }

        // get the address

        struct sockaddr_in sockAddr;
        std::memset( (char *)&sockAddr, 0, sizeof(sockAddr ) );
        socklen_t length = sizeof(sockAddr);
        if (getsockname(socket_, (struct sockaddr *)&sockAddr, &length) < 0) {
            throw std::runtime_error("unable to getsockname\n");
        }
        
		if( isConnected_ ){
			// reconnect to the connected address
			
			if (connect(socket_, (struct sockaddr *)&connectedAddr_, sizeof(connectedAddr_)) < 0) {
				throw std::runtime_error("unable to connect udp socket\n");
			}

		}else{
			// unconnect from the remote address
		
			struct sockaddr_in unconnectSockAddr;
			std::memset( (char *)&unconnectSockAddr, 0, sizeof(unconnectSockAddr ) );
			unconnectSockAddr.sin_family = AF_UNSPEC;
			// address fields are zero
			int connectResult = connect(socket_, (struct sockaddr *)&unconnectSockAddr, sizeof(unconnectSockAddr));
			if ( connectResult < 0 && errno != EAFNOSUPPORT ) {
				throw std::runtime_error("unable to un-connect udp socket\n");
			}
		}

		return IpEndpointNameFromSockaddr( sockAddr );
	}